

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_STRING::Load
          (_Type_STRING *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  byte bVar1;
  String *pSVar2;
  bool bVar3;
  String local_a0;
  char local_79;
  string local_78 [7];
  uchar c;
  string str;
  allocator<LiteScript::String> local_41;
  offset_in_Memory_to_subr oStack_40;
  allocator<LiteScript::String> allocator;
  offset_in_Memory_to_subr caller_local;
  Object *object_local;
  istream *stream_local;
  _Type_STRING *this_local;
  
  oStack_40 = caller;
  Object::Reassign(object,(Type *)_type_string,0x20);
  std::allocator<LiteScript::String>::allocator(&local_41);
  pSVar2 = Object::GetData<LiteScript::String>(object);
  __gnu_cxx::new_allocator<LiteScript::String>::construct<LiteScript::String>
            ((new_allocator<LiteScript::String> *)&local_41,pSVar2);
  std::__cxx11::string::string(local_78);
  while( true ) {
    bVar1 = std::ios::eof();
    bVar3 = false;
    if ((bVar1 & 1) == 0) {
      local_79 = std::istream::get();
      bVar3 = local_79 != '\0';
    }
    if (!bVar3) break;
    std::__cxx11::string::operator+=(local_78,local_79);
  }
  String::String(&local_a0,(string *)local_78);
  pSVar2 = Object::GetData<LiteScript::String>(object);
  String::operator=(pSVar2,&local_a0);
  String::~String(&local_a0);
  std::__cxx11::string::~string(local_78);
  std::allocator<LiteScript::String>::~allocator(&local_41);
  return;
}

Assistant:

void LiteScript::_Type_STRING::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::STRING, sizeof(String));
    std::allocator<String> allocator;
    allocator.construct(&object.GetData<String>());
    std::string str;
    unsigned char c;
    while (!stream.eof() && (c = (unsigned char)stream.get()) != 0)
        str += c;
    object.GetData<String>() = String(str);
}